

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall DIntermissionScreenScroller::Drawer(DIntermissionScreenScroller *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FTexture *img;
  FTexture *img_00;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double local_58;
  double local_48;
  
  uVar5 = (this->mFirstPic).texnum;
  if (uVar5 < TexMan.Textures.Count) {
    img = TexMan.Textures.Array[(int)uVar5].Texture;
  }
  else {
    img = (FTexture *)0x0;
  }
  uVar5 = (this->mSecondPic).texnum;
  if (uVar5 < TexMan.Textures.Count) {
    img_00 = TexMan.Textures.Array[(int)uVar5].Texture;
  }
  else {
    img_00 = (FTexture *)0x0;
  }
  iVar1 = (this->super_DIntermissionScreen).mTicker;
  iVar2 = this->mScrollDelay;
  if ((((iVar1 < iVar2) || (img_00 == (FTexture *)0x0)) || (img == (FTexture *)0x0)) ||
     (iVar3 = this->mScrollTime, iVar2 + iVar3 <= iVar1)) {
    DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
    return;
  }
  uVar5 = (uint)((double)((uint)img->Width * 2) / (img->Scale).X);
  uVar5 = (uVar5 & 1) + ((int)uVar5 >> 1);
  uVar6 = (uint)((double)((uint)img->Height * 2) / (img->Scale).Y);
  uVar6 = (uVar6 & 1) + ((int)uVar6 >> 1);
  iVar4 = this->mScrollDir;
  dVar9 = (double)(iVar1 - iVar2);
  if (iVar4 == 1) {
    dVar9 = (-dVar9 * (double)(int)uVar5) / (double)iVar3;
    local_58 = (double)(int)uVar5 + dVar9;
LAB_0032b023:
    local_48 = 0.0;
    uVar7 = SUB84(dVar9,0);
    uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
    dVar9 = 0.0;
  }
  else {
    if (iVar4 == 3) {
      dVar9 = (-dVar9 * (double)(int)uVar6) / (double)iVar3;
      local_48 = (double)(int)uVar6 + dVar9;
    }
    else {
      if (iVar4 != 2) {
        dVar9 = (dVar9 * (double)(int)uVar5) / (double)iVar3;
        local_58 = dVar9 - (double)(int)uVar5;
        goto LAB_0032b023;
      }
      dVar9 = (dVar9 * (double)(int)uVar6) / (double)iVar3;
      local_48 = dVar9 - (double)(int)uVar6;
    }
    uVar7 = 0;
    uVar8 = 0;
    local_58 = 0.0;
  }
  DCanvas::DrawTexture
            ((DCanvas *)screen,img,(double)CONCAT44(uVar8,uVar7),dVar9,0x40001399,(ulong)uVar5,
             0x4000139a,(ulong)uVar6,0x400013a5,0,0);
  DCanvas::DrawTexture
            ((DCanvas *)screen,img_00,local_58,local_48,0x40001399,(ulong)uVar5,0x4000139a,
             (ulong)uVar6,0x400013a5,0,0);
  DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  (this->super_DIntermissionScreen).mBackground.texnum = (this->mSecondPic).texnum;
  return;
}

Assistant:

void DIntermissionScreenScroller::Drawer ()
{
	FTexture *tex = TexMan[mFirstPic];
	FTexture *tex2 = TexMan[mSecondPic];
	if (mTicker >= mScrollDelay && mTicker < mScrollDelay + mScrollTime && tex != NULL && tex2 != NULL)
	{

		int fwidth = tex->GetScaledWidth();
		int fheight = tex->GetScaledHeight();

		double xpos1 = 0, ypos1 = 0, xpos2 = 0, ypos2 = 0;

		switch (mScrollDir)
		{
		case SCROLL_Up:
			ypos1 = double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 - fheight;
			break;

		case SCROLL_Down:
			ypos1 = -double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 + fheight;
			break;

		case SCROLL_Left:
		default:
			xpos1 = double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 - fwidth;
			break;

		case SCROLL_Right:
			xpos1 = -double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 + fwidth;
			break;
		}

		screen->DrawTexture (tex, xpos1, ypos1,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);
		screen->DrawTexture (tex2, xpos2, ypos2,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);

		screen->FillBorder (NULL);
		mBackground = mSecondPic;
	}
	else 
	{
		Super::Drawer();
	}
}